

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_adios.cpp
# Opt level: O2

adios2_io * adios2_declare_io(adios2_adios *adios,char *name)

{
  adios2_io *paVar1;
  allocator local_70 [32];
  string local_50 [32];
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"for adios2_adios, in call to adios2_declare_io",local_70);
  adios2::helper::CheckForNullptr<adios2_adios>(adios,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string(local_50,name,local_70);
  paVar1 = (adios2_io *)adios2::core::ADIOS::DeclareIO(adios,local_50,2);
  std::__cxx11::string::~string(local_50);
  return paVar1;
}

Assistant:

adios2_io *adios2_declare_io(adios2_adios *adios, const char *name)
{
    adios2_io *io = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(adios, "for adios2_adios, in call to adios2_declare_io");
        io = reinterpret_cast<adios2_io *>(
            &reinterpret_cast<adios2::core::ADIOS *>(adios)->DeclareIO(name));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_declare_io");
    }
    return io;
}